

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O2

void __thiscall
spdlog::async_logger::async_logger<std::shared_ptr<spdlog::sinks::sink>const*>
          (async_logger *this,string *logger_name,shared_ptr<spdlog::sinks::sink> **begin,
          shared_ptr<spdlog::sinks::sink> **end,size_t queue_size,
          async_overflow_policy overflow_policy,function<void_()> *worker_warmup_cb,
          milliseconds *flush_interval_ms,function<void_()> *worker_teardown_cb)

{
  async_log_helper *this_00;
  __shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2> local_d8;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  local_c8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b0;
  function<void_()> local_90;
  function<void_()> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)logger_name);
  spdlog::logger::logger<std::shared_ptr<spdlog::sinks::sink>const*>
            (&this->super_logger,&local_50,begin,end);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__async_logger_001bab98;
  this_00 = (async_log_helper *)operator_new(0x1c8);
  std::__shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,
             &(this->super_logger)._formatter.
              super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::vector(&local_c8,&(this->super_logger)._sinks);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_b0,&(this->super_logger)._err_handler);
  std::function<void_()>::function(&local_70,worker_warmup_cb);
  std::function<void_()>::function(&local_90,worker_teardown_cb);
  details::async_log_helper::async_log_helper
            (this_00,(formatter_ptr *)&local_d8,&local_c8,queue_size,&local_b0,overflow_policy,
             &local_70,flush_interval_ms,&local_90);
  (this->_async_log_helper)._M_t.
  super___uniq_ptr_impl<spdlog::details::async_log_helper,_std::default_delete<spdlog::details::async_log_helper>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::details::async_log_helper_*,_std::default_delete<spdlog::details::async_log_helper>_>
  .super__Head_base<0UL,_spdlog::details::async_log_helper_*,_false>._M_head_impl = this_00;
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  return;
}

Assistant:

inline spdlog::async_logger::async_logger(const std::string &logger_name, const It &begin, const It &end, size_t queue_size,
    const async_overflow_policy overflow_policy, const std::function<void()> &worker_warmup_cb,
    const std::chrono::milliseconds &flush_interval_ms, const std::function<void()> &worker_teardown_cb)
    : logger(logger_name, begin, end)
    , _async_log_helper(new details::async_log_helper(
          _formatter, _sinks, queue_size, _err_handler, overflow_policy, worker_warmup_cb, flush_interval_ms, worker_teardown_cb))
{
}